

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O0

bool __thiscall cashew::JSPrinter::endsInBlock(JSPrinter *this,Ref node)

{
  bool bVar1;
  Value *pVVar2;
  undefined8 *puVar3;
  Ref *pRVar4;
  ulong uVar5;
  undefined8 *local_48;
  JSPrinter *this_local;
  Ref node_local;
  
  this_local = (JSPrinter *)node.inst;
  pVVar2 = Ref::operator->((Ref *)&this_local);
  bVar1 = Value::isArray(pVVar2);
  if (bVar1) {
    pRVar4 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
    uVar5 = cashew::Ref::operator==(pRVar4,(IString *)&BLOCK);
    if ((uVar5 & 1) != 0) {
      return true;
    }
  }
  pVVar2 = Ref::operator->((Ref *)&this_local);
  bVar1 = Value::isArray(pVVar2);
  if (bVar1) {
    pRVar4 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
    uVar5 = cashew::Ref::operator==(pRVar4,(IString *)&LABEL);
    if ((uVar5 & 1) != 0) {
      puVar3 = (undefined8 *)cashew::Ref::operator[]((uint)&this_local);
      bVar1 = endsInBlock(this,(Value *)*puVar3);
      if (bVar1) {
        return true;
      }
    }
  }
  pVVar2 = Ref::operator->((Ref *)&this_local);
  bVar1 = Value::isArray(pVVar2);
  if (bVar1) {
    pRVar4 = (Ref *)cashew::Ref::operator[]((uint)&this_local);
    uVar5 = cashew::Ref::operator==(pRVar4,(IString *)&IF);
    if ((uVar5 & 1) != 0) {
      bVar1 = ifHasElse((Ref)this_local);
      if (bVar1) {
        local_48 = (undefined8 *)cashew::Ref::operator[]((uint)&this_local);
      }
      else {
        local_48 = (undefined8 *)cashew::Ref::operator[]((uint)&this_local);
      }
      bVar1 = endsInBlock(this,(Value *)*local_48);
      if (bVar1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool endsInBlock(Ref node) {
    if (node->isArray() && node[0] == BLOCK) {
      return true;
    }
    // Check for a label on a block
    if (node->isArray() && node[0] == LABEL && endsInBlock(node[2])) {
      return true;
    }
    // Check for an if
    if (node->isArray() && node[0] == IF &&
        endsInBlock(ifHasElse(node) ? node[3] : node[2])) {
      return true;
    }
    return false;
  }